

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardhandler.cpp
# Opt level: O2

void __thiscall QEvdevKeyboardHandler::readKeycode(QEvdevKeyboardHandler *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  QKeycodeAction QVar4;
  ssize_t sVar5;
  int *piVar6;
  QKeycodeAction QVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  char local_358 [24];
  char *local_340;
  input_event buffer [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(buffer,0xaa,0x300);
  uVar9 = 0;
LAB_0012145c:
  do {
    iVar2 = (this->m_fd).m_fd;
    do {
      sVar5 = read(iVar2,(void *)((long)&buffer[0].time.tv_sec + uVar9),0x300 - uVar9);
      if (sVar5 != -1) {
        iVar2 = (int)sVar5;
        if (iVar2 == 0) {
          local_358[0] = '\x02';
          local_358[1] = '\0';
          local_358[2] = '\0';
          local_358[3] = '\0';
          local_358[0x14] = '\0';
          local_358[0x15] = '\0';
          local_358[0x16] = '\0';
          local_358[0x17] = '\0';
          local_358[4] = '\0';
          local_358[5] = '\0';
          local_358[6] = '\0';
          local_358[7] = '\0';
          local_358[8] = '\0';
          local_358[9] = '\0';
          local_358[10] = '\0';
          local_358[0xb] = '\0';
          local_358[0xc] = '\0';
          local_358[0xd] = '\0';
          local_358[0xe] = '\0';
          local_358[0xf] = '\0';
          local_358[0x10] = '\0';
          local_358[0x11] = '\0';
          local_358[0x12] = '\0';
          local_358[0x13] = '\0';
          local_340 = "default";
          QMessageLogger::warning(local_358,"evdevkeyboard: Got EOF from the input device");
          goto LAB_001215ef;
        }
        if (-1 < iVar2) {
          uVar8 = (int)uVar9 + iVar2;
          uVar9 = (ulong)uVar8;
          if (uVar8 % 0x18 != 0) goto LAB_0012145c;
          lVar10 = 0;
          goto LAB_001214dd;
        }
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        break;
      }
      piVar6 = __errno_location();
      iVar3 = *piVar6;
    } while (iVar3 == 4);
  } while ((iVar3 == 4) || (iVar3 == 0xb));
  qErrnoWarning("evdevkeyboard: Could not read from input device");
  if (*piVar6 == 0x13) {
    if (this->m_notify != (QSocketNotifier *)0x0) {
      (**(code **)(*(long *)this->m_notify + 0x20))();
    }
    this->m_notify = (QSocketNotifier *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QFdContainer::reset(&this->m_fd);
      return;
    }
  }
  else {
LAB_001215ef:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
LAB_001214dd:
  if ((uVar9 / 0x18) * 0x18 - lVar10 == 0) goto LAB_001215ef;
  if (*(short *)((long)&buffer[0].type + lVar10) == 1) {
    iVar2 = *(int *)((long)&buffer[0].value + lVar10);
    QVar4 = processKeycode(this,*(quint16 *)((long)&buffer[0].code + lVar10),iVar2 != 0,iVar2 == 2);
    if (QVar4 - CapsLockOff < 2) {
      QVar7 = CapsLockOn;
      iVar2 = 1;
    }
    else if (QVar4 + 0xfd000000 < 2) {
      QVar7 = ScrollLockOn;
      iVar2 = 2;
    }
    else {
      if (1 < QVar4 + 0xfe000000) goto LAB_0012155b;
      iVar2 = 0;
      QVar7 = NumLockOn;
    }
    switchLed(this,iVar2,QVar4 == QVar7);
  }
LAB_0012155b:
  lVar10 = lVar10 + 0x18;
  goto LAB_001214dd;
}

Assistant:

void QEvdevKeyboardHandler::readKeycode()
{
    struct ::input_event buffer[32];
    int n = 0;

    forever {
        int result = qt_safe_read(m_fd.get(), reinterpret_cast<char *>(buffer) + n, sizeof(buffer) - n);

        if (result == 0) {
            qWarning("evdevkeyboard: Got EOF from the input device");
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning("evdevkeyboard: Could not read from input device");
                // If the device got disconnected, stop reading, otherwise we get flooded
                // by the above error over and over again.
                if (errno == ENODEV) {
                    delete m_notify;
                    m_notify = nullptr;
                    m_fd.reset();
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(buffer[0]) == 0)
                break;
        }
    }